

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

iterator __thiscall
FlatMap<int,_MyStruct,_std::less<int>_>::find
          (FlatMap<int,_MyStruct,_std::less<int>_> *this,int *key)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  less<int> *this_00;
  pointer __y;
  int *in_RSI;
  long in_RDI;
  __normal_iterator<std::pair<int,_MyStruct>_*,_std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>_>
  pos;
  vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<std::pair<int,_MyStruct>_*,_std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>_>
  *in_stack_ffffffffffffffa0;
  bool local_41;
  __normal_iterator<std::pair<int,_MyStruct>_*,_std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>_>
  local_20;
  int *local_18;
  pair<int,_MyStruct> *local_8;
  
  local_18 = in_RSI;
  iVar2 = std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>::begin
                    (in_stack_ffffffffffffff98);
  iVar3 = std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>::end
                    (in_stack_ffffffffffffff98);
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<int,MyStruct>*,std::vector<std::pair<int,MyStruct>,std::allocator<std::pair<int,MyStruct>>>>,int,FlatMap<int,MyStruct,std::less<int>>::ValueToKeyComparator>
                       (iVar2._M_current,iVar3._M_current,local_18);
  std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>::end
            (in_stack_ffffffffffffff98);
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffffa0,
                     (__normal_iterator<std::pair<int,_MyStruct>_*,_std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>_>
                      *)in_stack_ffffffffffffff98);
  local_41 = true;
  if (!bVar1) {
    this_00 = (less<int> *)(in_RDI + 0x18);
    __y = __gnu_cxx::
          __normal_iterator<std::pair<int,_MyStruct>_*,_std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>_>
          ::operator->(&local_20);
    local_41 = std::less<int>::operator()(this_00,local_18,&__y->first);
  }
  if (local_41 == false) {
    local_8 = local_20._M_current;
  }
  else {
    local_8 = (pair<int,_MyStruct> *)
              std::vector<std::pair<int,_MyStruct>,_std::allocator<std::pair<int,_MyStruct>_>_>::end
                        (in_stack_ffffffffffffff98);
  }
  return (iterator)local_8;
}

Assistant:

iterator find(const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.end();
        } else {
            return pos;
        }
    }